

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-sl.cpp
# Opt level: O3

bool __thiscall IntVarSL::setVal(IntVarSL *this,int64_t v,Reason r,bool channel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int *pt_1;
  Tint *pTVar6;
  int *pt;
  TrailElem local_30;
  
  iVar3 = (this->values).sz - 1;
  iVar5 = 0;
  do {
    uVar4 = (iVar3 + iVar5) / 2;
    iVar1 = (this->values).data[uVar4];
    iVar2 = (int)v;
    if (iVar1 == iVar2) {
      if (1 < iVar3 + iVar5 + 3U) {
        iVar3 = (*(this->el->super_IntVar).super_Var.super_Branching._vptr_Branching[0x10])
                          (this->el,(long)(int)uVar4,r.field_0,channel);
        if ((char)iVar3 == '\0') {
          return false;
        }
        local_30.x = (this->super_IntVar).min.v;
        if (local_30.x < v) {
          pTVar6 = &(this->super_IntVar).min;
          local_30.sz = 4;
          local_30.pt = &pTVar6->v;
          vec<TrailElem>::push(&engine.trail,&local_30);
          pTVar6->v = iVar2;
        }
        local_30.x = (this->super_IntVar).max.v;
        if (local_30.x <= v) {
          return true;
        }
        pTVar6 = &(this->super_IntVar).max;
        local_30.sz = 4;
        local_30.pt = &pTVar6->v;
        vec<TrailElem>::push(&engine.trail,&local_30);
        pTVar6->v = iVar2;
        return true;
      }
      break;
    }
    if (iVar1 < iVar2) {
      iVar5 = uVar4 + 1;
    }
    else {
      iVar3 = uVar4 - 1;
    }
  } while (iVar5 <= iVar3);
  if (channel) {
    SAT::cEnqueue(&sat,(Lit)0x0,r);
  }
  return false;
}

Assistant:

bool IntVarSL::setVal(int64_t v, Reason r, bool channel) {
	assert(setValNotR(v));
	const int u = find_index(static_cast<int>(v), ROUND_NONE);
	if (u == -1) {
		if (channel) {
			sat.cEnqueue(lit_False, r);
		}
		assert(sat.confl);
		return false;
	}
	if (!el->setVal(u, r, channel)) {
		return false;
	}
	if (min < v) {
		min = static_cast<int>(v);
	}
	if (max > v) {
		max = static_cast<int>(v);
	}
	return true;
}